

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qnativesocketengine.cpp
# Opt level: O1

void __thiscall
QNativeSocketEnginePrivate::~QNativeSocketEnginePrivate(QNativeSocketEnginePrivate *this)

{
  Data *pDVar1;
  
  *(undefined ***)&this->super_QAbstractSocketEnginePrivate =
       &PTR__QAbstractSocketEnginePrivate_002d1a48;
  QHostAddress::~QHostAddress(&(this->super_QAbstractSocketEnginePrivate).peerAddress);
  QHostAddress::~QHostAddress(&(this->super_QAbstractSocketEnginePrivate).localAddress);
  pDVar1 = (this->super_QAbstractSocketEnginePrivate).socketErrorString.d.d;
  if (pDVar1 != (Data *)0x0) {
    LOCK();
    (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate
                (&((this->super_QAbstractSocketEnginePrivate).socketErrorString.d.d)->
                  super_QArrayData,2,0x10);
    }
  }
  QObjectPrivate::~QObjectPrivate((QObjectPrivate *)this);
  return;
}

Assistant:

QNativeSocketEnginePrivate::~QNativeSocketEnginePrivate()
{
}